

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

int ConvexDecomposition::calchullgen(float3 *verts,int verts_count,int vlimit)

{
  float3 *pfVar1;
  float3 *pfVar2;
  float3 *v2;
  uint *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int *piVar10;
  float fVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  cbtHullTriangle *pcVar16;
  cbtHullTriangle *t_00;
  cbtHullTriangle *t_01;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [56];
  undefined1 auVar30 [64];
  float fVar32;
  undefined1 auVar33 [64];
  undefined1 auVar34 [60];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  int4 iVar38;
  float3 fVar39;
  int3 t;
  float3 local_e0;
  ulong local_d0;
  Array<int> local_c8;
  float3 *local_b0;
  int local_a4;
  ulong local_a0;
  undefined1 local_98 [16];
  ulong local_80;
  ulong local_78;
  cbtHullTriangle *local_70;
  float local_64;
  float local_60;
  float local_5c;
  undefined1 local_58 [16];
  Array<int> local_48;
  
  iVar20 = 0;
  if (3 < verts_count) {
    uVar4 = verts->x;
    uVar7 = verts->y;
    local_98._4_4_ = uVar7;
    local_98._0_4_ = uVar4;
    local_98._8_8_ = 0;
    fVar32 = verts->z;
    local_c8._0_12_ = ZEXT812(0);
    local_c8.array_size = 0;
    Array<int>::allocate(&local_c8,verts_count);
    local_48.element = (int *)0x0;
    local_48.count = 0;
    local_48.array_size = 0;
    Array<int>::allocate(&local_48,verts_count);
    auVar36 = ZEXT464((uint)fVar32);
    lVar21 = 0;
    local_58 = local_98;
    local_a4 = verts_count;
    do {
      Array<int>::Add(&local_48,1);
      Array<int>::Add(&local_c8,0);
      iVar20 = local_a4;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)((long)&verts->x + lVar21);
      puVar3 = (uint *)((long)&verts->z + lVar21);
      lVar21 = lVar21 + 0xc;
      local_98 = vminps_avx(local_98,auVar25);
      local_58 = vmaxps_avx(local_58,auVar25);
      auVar25 = ZEXT416(*puVar3);
      auVar29 = vminss_avx(ZEXT416(auVar36._0_4_),auVar25);
      auVar36 = ZEXT1664(auVar29);
      auVar25 = vmaxss_avx(ZEXT416((uint)fVar32),auVar25);
      fVar32 = auVar25._0_4_;
    } while ((ulong)(uint)verts_count * 0xc != lVar21);
    iVar38 = FindSimplex(verts,local_a4,&local_48);
    uVar19 = iVar38._8_8_;
    uVar22 = iVar38._0_8_;
    iVar14 = iVar38.x;
    if (iVar14 == -1) {
      iVar20 = 0;
    }
    else {
      lVar17 = (long)uVar22 >> 0x20;
      iVar13 = iVar38.z;
      lVar21 = (long)uVar19 >> 0x20;
      local_60 = verts[iVar14].y + verts[lVar17].y + verts[iVar13].y + verts[lVar21].y;
      local_5c = verts[iVar14].x + verts[lVar17].x + verts[iVar13].x + verts[lVar21].x;
      auVar36 = ZEXT464((uint)local_5c);
      local_64 = verts[iVar14].z + verts[lVar17].z + verts[iVar13].z + verts[lVar21].z;
      pcVar16 = (cbtHullTriangle *)::operator_new(0x24);
      (pcVar16->super_int3).x = iVar13;
      iVar13 = iVar38.w;
      (pcVar16->super_int3).y = iVar13;
      iVar14 = iVar38.y;
      (pcVar16->super_int3).z = iVar14;
      (pcVar16->n).x = -1;
      (pcVar16->n).y = -1;
      (pcVar16->n).z = -1;
      pcVar16->id = DAT_00b6ffa0;
      local_d0 = uVar22;
      local_a0 = uVar19;
      Array<ConvexDecomposition::cbtHullTriangle_*>::Add
                ((Array<ConvexDecomposition::cbtHullTriangle_*> *)&tris,pcVar16);
      pcVar16->vmax = -1;
      pcVar16->rise = 0.0;
      (pcVar16->n).x = 2;
      (pcVar16->n).y = 3;
      (pcVar16->n).z = 1;
      local_70 = pcVar16;
      pcVar16 = (cbtHullTriangle *)::operator_new(0x24);
      (pcVar16->super_int3).x = iVar13;
      (pcVar16->super_int3).y = (int)local_a0;
      uVar15 = DAT_00b6ffa0;
      (pcVar16->super_int3).z = (int)local_d0;
      (pcVar16->n).x = -1;
      (pcVar16->n).y = -1;
      (pcVar16->n).z = -1;
      pcVar16->id = uVar15;
      local_b0 = verts;
      local_80 = (ulong)(uint)vlimit;
      Array<ConvexDecomposition::cbtHullTriangle_*>::Add
                ((Array<ConvexDecomposition::cbtHullTriangle_*> *)&tris,pcVar16);
      pcVar16->vmax = -1;
      pcVar16->rise = 0.0;
      (pcVar16->n).x = 3;
      (pcVar16->n).y = 2;
      (pcVar16->n).z = 0;
      t_00 = (cbtHullTriangle *)::operator_new(0x24);
      uVar15 = DAT_00b6ffa0;
      (t_00->super_int3).x = (int)local_d0;
      (t_00->super_int3).y = iVar14;
      (t_00->super_int3).z = iVar13;
      (t_00->n).x = -1;
      (t_00->n).y = -1;
      (t_00->n).z = -1;
      t_00->id = uVar15;
      Array<ConvexDecomposition::cbtHullTriangle_*>::Add
                ((Array<ConvexDecomposition::cbtHullTriangle_*> *)&tris,t_00);
      t_00->vmax = -1;
      t_00->rise = 0.0;
      (t_00->n).x = 0;
      (t_00->n).y = 1;
      (t_00->n).z = 3;
      t_01 = (cbtHullTriangle *)::operator_new(0x24);
      uVar12 = local_a0;
      (t_01->super_int3).x = iVar14;
      uVar15 = DAT_00b6ffa0;
      (t_01->super_int3).y = (int)local_d0;
      uVar23 = (uint)local_a0;
      (t_01->super_int3).z = uVar23;
      (t_01->n).x = -1;
      (t_01->n).y = -1;
      (t_01->n).z = -1;
      t_01->id = uVar15;
      local_78 = uVar22 >> 0x20;
      Array<ConvexDecomposition::cbtHullTriangle_*>::Add
                ((Array<ConvexDecomposition::cbtHullTriangle_*> *)&tris,t_01);
      t_01->vmax = -1;
      t_01->rise = 0.0;
      (t_01->n).x = 1;
      (t_01->n).y = 0;
      (t_01->n).z = 2;
      if (((long)uVar12 < 0) || (local_c8.count <= iVar13)) {
LAB_00907878:
        pcVar18 = "Type &ConvexDecomposition::Array<int>::operator[](int) [Type = int]";
LAB_0090786e:
        __assert_fail("i>=0 && i<count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                      ,0x577,pcVar18);
      }
      local_c8.element[uVar19 >> 0x20] = 1;
      if (((int)uVar23 < 0) ||
         (((local_c8.count <= (int)uVar23 ||
           (local_c8.element[uVar23 & 0x7fffffff] = 1, (long)local_d0 < 0)) ||
          (local_c8.count <= (int)local_78)))) goto LAB_00907878;
      local_c8.element[local_78] = 1;
      uVar15 = (uint)local_d0;
      if (((int)uVar15 < 0) || (local_c8.count <= (int)uVar15)) goto LAB_00907878;
      local_c8.element[uVar15 & 0x7fffffff] = 1;
      checkit(local_70);
      checkit(pcVar16);
      checkit(t_00);
      checkit(t_01);
      pfVar2 = local_b0;
      if (0 < (int)DAT_00b6ffa0) {
        lVar21 = 0;
        do {
          auVar31 = auVar36._8_56_;
          piVar10 = *(int **)(tris + lVar21 * 8);
          if (piVar10 == (int *)0x0) {
            __assert_fail("t",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x9dc,"int ConvexDecomposition::calchullgen(float3 *, int, int)");
          }
          if (-1 < piVar10[7]) {
            __assert_fail("t->vmax<0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x9dd,"int ConvexDecomposition::calchullgen(float3 *, int, int)");
          }
          fVar39 = TriNormal(pfVar2 + *piVar10,pfVar2 + piVar10[1],pfVar2 + piVar10[2]);
          local_e0.z = fVar39.z;
          auVar36._0_8_ = fVar39._0_8_;
          auVar36._8_56_ = auVar31;
          local_e0._0_8_ = vmovlps_avx(auVar36._0_16_);
          iVar13 = maxdirsterid<ConvexDecomposition::float3>(pfVar2,iVar20,&local_e0,&local_48);
          piVar10[7] = iVar13;
          lVar21 = lVar21 + 1;
          iVar14 = *piVar10;
          fVar11 = pfVar2[iVar13].x - pfVar2[iVar14].x;
          auVar36 = ZEXT464((uint)fVar11);
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)((pfVar2[iVar13].y - pfVar2[iVar14].y) *
                                                  local_e0.y)),ZEXT416((uint)fVar11),
                                    ZEXT416((uint)local_e0.x));
          auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)(pfVar2[iVar13].z - pfVar2[iVar14].z)),
                                    ZEXT416((uint)local_e0.z));
          piVar10[8] = auVar25._0_4_;
        } while (lVar21 < (int)DAT_00b6ffa0);
      }
      iVar20 = 1;
      uVar22 = 0x3b9ac9fc;
      if ((int)local_80 != 0) {
        uVar22 = (ulong)((int)local_80 - 4);
      }
      if (0 < (int)uVar22) {
        auVar25 = vsubps_avx(local_58,local_98);
        auVar26._0_4_ = auVar25._0_4_ * auVar25._0_4_;
        auVar26._4_4_ = auVar25._4_4_ * auVar25._4_4_;
        auVar26._8_4_ = auVar25._8_4_ * auVar25._8_4_;
        auVar26._12_4_ = auVar25._12_4_ * auVar25._12_4_;
        auVar25 = vhaddps_avx(auVar26,auVar26);
        fVar32 = fVar32 - auVar29._0_4_;
        auVar25 = ZEXT416((uint)(fVar32 * fVar32 + auVar25._0_4_));
        auVar25 = vsqrtss_avx(auVar25,auVar25);
        fVar32 = auVar25._0_4_ * 0.001;
        auVar33 = ZEXT464((uint)fVar32);
        local_80 = CONCAT44(local_80._4_4_,fVar32);
        local_a0 = CONCAT44(local_a0._4_4_,local_64 * 0.25);
        fVar11 = fVar32 * 0.01;
        local_58._0_4_ = local_5c * 0.25;
        local_d0 = CONCAT44(local_d0._4_4_,local_60 * 0.25);
        local_70 = (cbtHullTriangle *)CONCAT44(local_70._4_4_,fVar32 * fVar32 * 0.1);
        do {
          auVar30 = ZEXT464((uint)(float)local_80);
          pcVar16 = extrudable((float)local_80);
          pfVar2 = local_b0;
          if (pcVar16 == (cbtHullTriangle *)0x0) break;
          iVar20 = pcVar16->vmax;
          lVar21 = (long)iVar20;
          if ((lVar21 < 0) || (local_c8.count <= iVar20)) goto LAB_00907878;
          local_78 = uVar22;
          if (local_c8.element[lVar21] != 0) {
            __assert_fail("!isextreme[v]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x9e8,"int ConvexDecomposition::calchullgen(float3 *, int, int)");
          }
          local_c8.element[lVar21] = 1;
          uVar22 = (ulong)DAT_00b6ffa0;
          if (uVar22 != 0) {
            pfVar1 = local_b0 + lVar21;
            do {
              if (((int)uVar22 < 1) || ((int)DAT_00b6ffa0 < (int)uVar22)) goto LAB_00907859;
              pcVar16 = *(cbtHullTriangle **)(tris + -8 + uVar22 * 8);
              if (pcVar16 != (cbtHullTriangle *)0x0) {
                local_e0.z = (float)(pcVar16->super_int3).z;
                auVar30 = ZEXT464((uint)fVar11);
                local_e0.x = (float)(pcVar16->super_int3).x;
                local_e0.y = (float)(pcVar16->super_int3).y;
                iVar14 = above(pfVar2,(int3 *)&local_e0,pfVar1,fVar11);
                if (iVar14 != 0) {
                  extrude(pcVar16,iVar20);
                }
              }
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
            uVar15 = DAT_00b6ffa0;
            uVar23 = DAT_00b6ffa0;
            if (DAT_00b6ffa0 != 0) {
              do {
                lVar21 = tris;
                auVar34 = auVar33._4_60_;
                auVar31 = auVar30._8_56_;
                if (((int)uVar23 < 1) || ((int)uVar15 < (int)uVar23)) goto LAB_00907859;
                uVar23 = uVar23 - 1;
                piVar10 = *(int **)(tris + (ulong)uVar23 * 8);
                if (piVar10 != (int *)0x0) {
                  if (((*piVar10 != iVar20) && (piVar10[1] != iVar20)) && (piVar10[2] != iVar20))
                  break;
                  local_98._0_4_ = uVar15;
                  pfVar2 = local_b0 + *piVar10;
                  pfVar1 = local_b0 + piVar10[1];
                  v2 = local_b0 + piVar10[2];
                  fVar39 = TriNormal(pfVar2,pfVar1,v2);
                  auVar33._0_4_ = fVar39.z;
                  auVar33._4_60_ = auVar34;
                  auVar30._0_8_ = fVar39._0_8_;
                  auVar30._8_56_ = auVar31;
                  uVar22._0_4_ = pfVar2->x;
                  uVar22._4_4_ = pfVar2->y;
                  auVar27._8_8_ = 0;
                  auVar27._0_8_ = uVar22;
                  auVar25 = vmovshdup_avx(auVar30._0_16_);
                  auVar29 = vmovshdup_avx(auVar27);
                  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ *
                                                          ((float)local_d0 - auVar29._0_4_))),
                                            auVar30._0_16_,
                                            ZEXT416((uint)((float)local_58._0_4_ -
                                                          (float)(undefined4)uVar22)));
                  auVar25 = vfmadd231ss_fma(auVar25,auVar33._0_16_,
                                            ZEXT416((uint)((float)local_a0 - pfVar2->z)));
                  if (auVar25._0_4_ <= fVar11) {
                    uVar5 = pfVar1->y;
                    uVar8 = pfVar1->z;
                    auVar37._4_4_ = uVar8;
                    auVar37._0_4_ = uVar5;
                    auVar37._8_8_ = 0;
                    uVar19._0_4_ = pfVar1->x;
                    uVar19._4_4_ = pfVar1->y;
                    auVar24._8_8_ = 0;
                    auVar24._0_8_ = uVar19;
                    auVar29 = vsubps_avx(auVar24,auVar27);
                    uVar6 = v2->y;
                    uVar9 = v2->z;
                    auVar35._4_4_ = uVar9;
                    auVar35._0_4_ = uVar6;
                    auVar35._8_8_ = 0;
                    auVar27 = ZEXT416((uint)(pfVar1->z - pfVar2->z));
                    auVar24 = vpermt2ps_avx512vl(auVar29,_DAT_009d86b0,auVar27);
                    auVar26 = vsubps_avx(auVar35,auVar37);
                    auVar25 = vmovshdup_avx(auVar26);
                    auVar28 = ZEXT416((uint)(v2->x - (float)(undefined4)uVar19));
                    auVar27 = vfmsub231ss_fma(ZEXT416((uint)(auVar25._0_4_ * auVar29._0_4_)),auVar27
                                              ,auVar28);
                    auVar25 = vpermt2ps_avx512vl(auVar26,SUB6416(ZEXT464(4),0),auVar28);
                    auVar28._0_4_ = auVar25._0_4_ * auVar24._0_4_;
                    auVar28._4_4_ = auVar25._4_4_ * auVar24._4_4_;
                    auVar28._8_4_ = auVar25._8_4_ * auVar24._8_4_;
                    auVar28._12_4_ = auVar25._12_4_ * auVar24._12_4_;
                    auVar25 = vfmsub231ps_fma(auVar28,auVar29,auVar26);
                    auVar29._0_4_ = auVar25._0_4_ * auVar25._0_4_;
                    auVar29._4_4_ = auVar25._4_4_ * auVar25._4_4_;
                    auVar29._8_4_ = auVar25._8_4_ * auVar25._8_4_;
                    auVar29._12_4_ = auVar25._12_4_ * auVar25._12_4_;
                    auVar25 = vmovshdup_avx(auVar29);
                    auVar33 = ZEXT464((uint)local_70._0_4_);
                    auVar25 = ZEXT416((uint)(auVar29._0_4_ +
                                            auVar25._0_4_ + auVar27._0_4_ * auVar27._0_4_));
                    auVar25 = vsqrtss_avx(auVar25,auVar25);
                    auVar30 = ZEXT1664(auVar25);
                    uVar15 = local_98._0_4_;
                    if (local_70._0_4_ <= auVar25._0_4_) goto LAB_009076eb;
                  }
                  iVar14 = piVar10[3];
                  if (((long)iVar14 < 0) || ((int)local_98._0_4_ <= iVar14)) goto LAB_00907859;
                  pcVar16 = *(cbtHullTriangle **)(lVar21 + (long)iVar14 * 8);
                  if (pcVar16 == (cbtHullTriangle *)0x0) {
                    pcVar18 = "nb";
LAB_009078a8:
                    __assert_fail(pcVar18,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                  ,0x9fe,"int ConvexDecomposition::calchullgen(float3 *, int, int)")
                    ;
                  }
                  if ((((pcVar16->super_int3).x == iVar20) || ((pcVar16->super_int3).y == iVar20))
                     || ((pcVar16->super_int3).z == iVar20)) {
                    pcVar18 = "!hasvert(*nb,v)";
                    goto LAB_009078a8;
                  }
                  if ((int)uVar23 <= pcVar16->id) {
                    pcVar18 = "nb->id<j";
                    goto LAB_009078a8;
                  }
                  extrude(pcVar16,iVar20);
                  uVar15 = DAT_00b6ffa0;
                  uVar23 = DAT_00b6ffa0;
                }
LAB_009076eb:
              } while (uVar23 != 0);
              iVar20 = local_a4;
              if (uVar15 != 0) {
                uVar22 = (ulong)uVar15;
                do {
                  pfVar2 = local_b0;
                  auVar34 = auVar33._4_60_;
                  auVar31 = auVar30._8_56_;
                  if (((int)uVar22 < 1) || ((int)DAT_00b6ffa0 < (int)uVar22)) goto LAB_00907859;
                  piVar10 = *(int **)(tris + -8 + uVar22 * 8);
                  if (piVar10 != (int *)0x0) {
                    if (-1 < piVar10[7]) break;
                    fVar39 = TriNormal(local_b0 + *piVar10,local_b0 + piVar10[1],
                                       local_b0 + piVar10[2]);
                    auVar33._0_4_ = fVar39.z;
                    auVar33._4_60_ = auVar34;
                    auVar30._0_8_ = fVar39._0_8_;
                    auVar30._8_56_ = auVar31;
                    local_e0._0_8_ = vmovlps_avx(auVar30._0_16_);
                    local_e0.z = auVar33._0_4_;
                    uVar15 = maxdirsterid<ConvexDecomposition::float3>
                                       (pfVar2,iVar20,&local_e0,&local_48);
                    piVar10[7] = uVar15;
                    if (((int)uVar15 < 0) || (local_c8.count <= (int)uVar15)) goto LAB_00907878;
                    if (local_c8.element[uVar15] == 0) {
                      iVar14 = *piVar10;
                      fVar32 = local_b0[uVar15].x - local_b0[iVar14].x;
                      auVar30 = ZEXT464((uint)fVar32);
                      auVar25 = vfmadd231ss_fma(ZEXT416((uint)((local_b0[uVar15].y -
                                                               local_b0[iVar14].y) * local_e0.y)),
                                                ZEXT416((uint)fVar32),ZEXT416((uint)local_e0.x));
                      auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)(local_b0[uVar15].z -
                                                                      local_b0[iVar14].z)),
                                                ZEXT416((uint)local_e0.z));
                      auVar33 = ZEXT1664(auVar25);
                      piVar10[8] = auVar25._0_4_;
                    }
                    else {
                      piVar10[7] = -1;
                    }
                  }
                  uVar22 = uVar22 - 1;
                } while (uVar22 != 0);
              }
            }
          }
          uVar22 = (ulong)((int)local_78 - 1);
        } while (1 < (int)local_78);
        iVar20 = 1;
      }
    }
    if (local_48.element != (int *)0x0) {
      free(local_48.element);
    }
    if (local_c8.element != (int *)0x0) {
      free(local_c8.element);
    }
  }
  return iVar20;
LAB_00907859:
  pcVar18 = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::cbtHullTriangle *>::operator[](int) [Type = ConvexDecomposition::cbtHullTriangle *]"
  ;
  goto LAB_0090786e;
}

Assistant:

int calchullgen(float3 *verts,int verts_count, int vlimit)
{
	if(verts_count <4) return 0;
	if(vlimit==0) vlimit=1000000000;
	int j;
	float3 bmin(*verts),bmax(*verts);
	Array<int> isextreme(verts_count);
	Array<int> allow(verts_count);
	for(j=0;j<verts_count;j++) 
	{
		allow.Add(1);
		isextreme.Add(0);
		bmin = VectorMin(bmin,verts[j]);
		bmax = VectorMax(bmax,verts[j]);
	}
	float epsilon = magnitude(bmax-bmin) * 0.001f;


	int4 p = FindSimplex(verts,verts_count,allow);
	if(p.x==-1) return 0; // simplex failed



	float3 center = (verts[p[0]]+verts[p[1]]+verts[p[2]]+verts[p[3]]) /4.0f;  // a valid interior point
	cbtHullTriangle *t0 = new cbtHullTriangle(p[2],p[3],p[1]); t0->n=int3(2,3,1);
	cbtHullTriangle *t1 = new cbtHullTriangle(p[3],p[2],p[0]); t1->n=int3(3,2,0);
	cbtHullTriangle *t2 = new cbtHullTriangle(p[0],p[1],p[3]); t2->n=int3(0,1,3);
	cbtHullTriangle *t3 = new cbtHullTriangle(p[1],p[0],p[2]); t3->n=int3(1,0,2);
	isextreme[p[0]]=isextreme[p[1]]=isextreme[p[2]]=isextreme[p[3]]=1;
	checkit(t0);checkit(t1);checkit(t2);checkit(t3);

	for(j=0;j<tris.count;j++)
	{
		cbtHullTriangle *t=tris[j];
		assert(t);
		assert(t->vmax<0);
		float3 n=TriNormal(verts[(*t)[0]],verts[(*t)[1]],verts[(*t)[2]]);
		t->vmax = maxdirsterid(verts,verts_count,n,allow);
		t->rise = dot(n,verts[t->vmax]-verts[(*t)[0]]);
	}
	cbtHullTriangle *te;
	vlimit-=4;
	while(vlimit >0 && (te=extrudable(epsilon)))
	{
		int3 ti=*te;
		int v=te->vmax;
		assert(!isextreme[v]);  // wtf we've already done this vertex
		isextreme[v]=1;
		//if(v==p0 || v==p1 || v==p2 || v==p3) continue; // done these already
		j=tris.count;
		while(j--) {
			if(!tris[j]) continue;
			int3 t=*tris[j];
			if(above(verts,t,verts[v],0.01f*epsilon)) 
			{
				extrude(tris[j],v);
			}
		}
		// now check for those degenerate cases where we have a flipped triangle or a really skinny triangle
		j=tris.count;
		while(j--)
		{
			if(!tris[j]) continue;
			if(!hasvert(*tris[j],v)) break;
			int3 nt=*tris[j];
			if(above(verts,nt,center,0.01f*epsilon)  || magnitude(cross(verts[nt[1]]-verts[nt[0]],verts[nt[2]]-verts[nt[1]]))< epsilon*epsilon*0.1f )
			{
				cbtHullTriangle *nb = tris[tris[j]->n[0]];
				assert(nb);assert(!hasvert(*nb,v));assert(nb->id<j);
				extrude(nb,v);
				j=tris.count; 
			}
		} 
		j=tris.count;
		while(j--)
		{
			cbtHullTriangle *t=tris[j];
			if(!t) continue;
			if(t->vmax>=0) break;
			float3 n=TriNormal(verts[(*t)[0]],verts[(*t)[1]],verts[(*t)[2]]);
			t->vmax = maxdirsterid(verts,verts_count,n,allow);
			if(isextreme[t->vmax]) 
			{
				t->vmax=-1; // already done that vertex - algorithm needs to be able to terminate.
			}
			else
			{
				t->rise = dot(n,verts[t->vmax]-verts[(*t)[0]]);
			}
		}
		vlimit --;
	}
	return 1;
}